

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O1

Int128 btConvexHullInternal::Int128::mul(int64_t a,int64_t b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  Int128 IVar8;
  Int128 IVar9;
  
  uVar4 = -a;
  if (0 < a) {
    uVar4 = a;
  }
  uVar1 = -b;
  if (0 < b) {
    uVar1 = b;
  }
  uVar7 = (uVar1 & 0xffffffff) * (uVar4 & 0xffffffff);
  uVar5 = (uVar4 & 0xffffffff) * (uVar1 >> 0x20);
  uVar6 = (uVar1 & 0xffffffff) * (uVar4 >> 0x20);
  uVar2 = (uVar6 & 0xffffffff) + (uVar5 & 0xffffffff);
  uVar3 = uVar2 << 0x20;
  IVar8.low = uVar3 + uVar7;
  IVar8.high = (uVar2 >> 0x20) +
               (uVar6 >> 0x20) + (uVar5 >> 0x20) + (uVar4 >> 0x20) * (uVar1 >> 0x20) +
               (ulong)CARRY8(uVar3,uVar7);
  if (-1 < (b ^ a)) {
    return IVar8;
  }
  IVar9.high = ~IVar8.high + (ulong)(IVar8.low == 0);
  IVar9.low = -IVar8.low;
  return IVar9;
}

Assistant:

btConvexHullInternal::Int128 btConvexHullInternal::Int128::mul(int64_t a, int64_t b)
{
	Int128 result;
	
#ifdef USE_X86_64_ASM
	__asm__ ("imulq %[b]"
					 : "=a" (result.low), "=d" (result.high)
					 : "0"(a), [b] "r"(b)
					 : "cc" );
	return result;
	
#else
	bool negative = a < 0;
	if (negative)
	{
		a = -a;
	}
	if (b < 0)
	{
		negative = !negative;
		b = -b;
	}
	DMul<uint64_t, uint32_t>::mul((uint64_t) a, (uint64_t) b, result.low, result.high);
	return negative ? -result : result;
#endif
}